

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestSubNinja::Run(ParserTestSubNinja *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference __rhs;
  Node *pNVar6;
  reference ppEVar7;
  string local_f0;
  string local_d0;
  string local_b0;
  StringPiece local_90;
  StringPiece local_80;
  int local_70;
  allocator<char> local_69;
  int fail_count;
  allocator<char> local_31;
  string local_30;
  ParserTestSubNinja *local_10;
  ParserTestSubNinja *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test.ninja",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fail_count,"var = inner\nbuild $builddir/inner: varref\n",&local_69);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_30,(string *)&fail_count);
  std::__cxx11::string::~string((string *)&fail_count);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_70 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "builddir = some_dir/\nrule varref\n  command = varref $var\nvar = outer\nbuild $builddir/outer: varref\nsubninja test.ninja\nbuild $builddir/outer2: varref\n"
            );
  iVar2 = local_70;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_ParserTest).fs_.files_read_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar5 == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x371,"1u == fs_.files_read_.size()");
    pTVar1 = g_current_test;
    if (bVar3) {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&(this->super_ParserTest).fs_.files_read_,0);
      bVar3 = std::operator==("test.ninja",__rhs);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x373,"\"test.ninja\" == fs_.files_read_[0]");
      pTVar1 = g_current_test;
      StringPiece::StringPiece(&local_80,"some_dir/outer");
      pNVar6 = State::LookupNode(&(this->super_ParserTest).state,local_80);
      testing::Test::Check
                (pTVar1,pNVar6 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x374,"state.LookupNode(\"some_dir/outer\")");
      pTVar1 = g_current_test;
      StringPiece::StringPiece(&local_90,"some_dir/inner");
      pNVar6 = State::LookupNode(&(this->super_ParserTest).state,local_90);
      testing::Test::Check
                (pTVar1,pNVar6 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x376,"state.LookupNode(\"some_dir/inner\")");
      pTVar1 = g_current_test;
      sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                        (&(this->super_ParserTest).state.edges_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar5 == 3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                         ,0x378,"3u == state.edges_.size()");
      pTVar1 = g_current_test;
      if (bVar3) {
        ppEVar7 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            (&(this->super_ParserTest).state.edges_,0);
        Edge::EvaluateCommand_abi_cxx11_(&local_b0,*ppEVar7,false);
        bVar3 = std::operator==("varref outer",&local_b0);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x379,"\"varref outer\" == state.edges_[0]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_b0);
        pTVar1 = g_current_test;
        ppEVar7 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            (&(this->super_ParserTest).state.edges_,1);
        Edge::EvaluateCommand_abi_cxx11_(&local_d0,*ppEVar7,false);
        bVar3 = std::operator==("varref inner",&local_d0);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37a,"\"varref inner\" == state.edges_[1]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_d0);
        pTVar1 = g_current_test;
        ppEVar7 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            (&(this->super_ParserTest).state.edges_,2);
        Edge::EvaluateCommand_abi_cxx11_(&local_f0,*ppEVar7,false);
        bVar3 = std::operator==("varref outer",&local_f0);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37b,"\"varref outer\" == state.edges_[2]->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_f0);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, SubNinja) {
  fs_.Create("test.ninja",
    "var = inner\n"
    "build $builddir/inner: varref\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"builddir = some_dir/\n"
"rule varref\n"
"  command = varref $var\n"
"var = outer\n"
"build $builddir/outer: varref\n"
"subninja test.ninja\n"
"build $builddir/outer2: varref\n"));
  ASSERT_EQ(1u, fs_.files_read_.size());

  EXPECT_EQ("test.ninja", fs_.files_read_[0]);
  EXPECT_TRUE(state.LookupNode("some_dir/outer"));
  // Verify our builddir setting is inherited.
  EXPECT_TRUE(state.LookupNode("some_dir/inner"));

  ASSERT_EQ(3u, state.edges_.size());
  EXPECT_EQ("varref outer", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("varref inner", state.edges_[1]->EvaluateCommand());
  EXPECT_EQ("varref outer", state.edges_[2]->EvaluateCommand());
}